

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O0

void __thiscall OPLmusicFile::OPLmusicFile(OPLmusicFile *this,OPLmusicFile *source,char *filename)

{
  OPLio *pOVar1;
  int iVar2;
  BYTE *pBVar3;
  DiskWriterIO *this_00;
  char *filename_local;
  OPLmusicFile *source_local;
  OPLmusicFile *this_local;
  
  OPLmusicBlock::OPLmusicBlock(&this->super_OPLmusicBlock);
  (this->super_OPLmusicBlock)._vptr_OPLmusicBlock = (_func_int **)&PTR__OPLmusicFile_009efc08;
  this->ScoreLen = source->ScoreLen;
  pBVar3 = (BYTE *)operator_new__((long)this->ScoreLen);
  (this->super_OPLmusicBlock).super_musicBlock.scoredata = pBVar3;
  memcpy((this->super_OPLmusicBlock).super_musicBlock.scoredata,
         (source->super_OPLmusicBlock).super_musicBlock.scoredata,(long)this->ScoreLen);
  (this->super_OPLmusicBlock).SamplesPerTick = (source->super_OPLmusicBlock).SamplesPerTick;
  this->RawPlayer = source->RawPlayer;
  (this->super_OPLmusicBlock).super_musicBlock.score =
       (source->super_OPLmusicBlock).super_musicBlock.score;
  (this->super_OPLmusicBlock).NumChips = (source->super_OPLmusicBlock).NumChips;
  this->WhichChip = 0;
  if (((this->super_OPLmusicBlock).super_musicBlock.io != (OPLio *)0x0) &&
     (pOVar1 = (this->super_OPLmusicBlock).super_musicBlock.io, pOVar1 != (OPLio *)0x0)) {
    (*pOVar1->_vptr_OPLio[1])();
  }
  this_00 = (DiskWriterIO *)operator_new(0x60);
  DiskWriterIO::DiskWriterIO(this_00,filename);
  (this->super_OPLmusicBlock).super_musicBlock.io = (OPLio *)this_00;
  pOVar1 = (this->super_OPLmusicBlock).super_musicBlock.io;
  iVar2 = (*pOVar1->_vptr_OPLio[2])(pOVar1,(ulong)(uint)(this->super_OPLmusicBlock).NumChips,0);
  (this->super_OPLmusicBlock).NumChips = iVar2;
  (*(this->super_OPLmusicBlock)._vptr_OPLmusicBlock[2])();
  return;
}

Assistant:

OPLmusicFile::OPLmusicFile(const OPLmusicFile *source, const char *filename)
{
	ScoreLen = source->ScoreLen;
	scoredata = new BYTE[ScoreLen];
	memcpy(scoredata, source->scoredata, ScoreLen);
	SamplesPerTick = source->SamplesPerTick;
	RawPlayer = source->RawPlayer;
	score = source->score;
	NumChips = source->NumChips;
	WhichChip = 0;
	if (io != NULL)
	{
		delete io;
	}
	io = new DiskWriterIO(filename);
	NumChips = io->OPLinit(NumChips);
	Restart();
}